

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::deleteRenderbuffer(ReferenceContext *this,Renderbuffer *renderbuffer)

{
  deUint32 dVar1;
  deUint32 dVar2;
  Framebuffer *local_60;
  Attachment local_50;
  int local_3c;
  Attachment *pAStack_38;
  int refNdx;
  Attachment *attachment;
  int point;
  int releaseRefCount;
  Framebuffer *framebufferBinding;
  Renderbuffer *pRStack_18;
  int ndx;
  Renderbuffer *renderbuffer_local;
  ReferenceContext *this_local;
  
  pRStack_18 = renderbuffer;
  renderbuffer_local = (Renderbuffer *)this;
  if (this->m_renderbufferBinding == renderbuffer) {
    (*(this->super_Context)._vptr_Context[0xc])(this,0x8d41,0);
  }
  for (framebufferBinding._4_4_ = 0; framebufferBinding._4_4_ < 2;
      framebufferBinding._4_4_ = framebufferBinding._4_4_ + 1) {
    if (framebufferBinding._4_4_ == 0) {
      local_60 = this->m_readFramebufferBinding;
    }
    else {
      local_60 = this->m_drawFramebufferBinding;
    }
    _point = local_60;
    if (local_60 != (Framebuffer *)0x0) {
      attachment._4_4_ =
           (uint)(local_60 == this->m_drawFramebufferBinding) +
           (uint)(local_60 == this->m_readFramebufferBinding);
      for (attachment._0_4_ = ATTACHMENTPOINT_COLOR0; (int)(AttachmentPoint)attachment < 3;
          attachment._0_4_ = (AttachmentPoint)attachment + ATTACHMENTPOINT_DEPTH) {
        pAStack_38 = rc::Framebuffer::getAttachment(_point,(AttachmentPoint)attachment);
        dVar1 = pAStack_38->name;
        dVar2 = rc::NamedObject::getName(&pRStack_18->super_NamedObject);
        if (dVar1 == dVar2) {
          for (local_3c = 0; local_3c < attachment._4_4_; local_3c = local_3c + 1) {
            releaseFboAttachmentReference(this,pAStack_38);
          }
          rc::Framebuffer::Attachment::Attachment(&local_50);
          pAStack_38->type = local_50.type;
          pAStack_38->name = local_50.name;
          pAStack_38->texTarget = local_50.texTarget;
          pAStack_38->level = local_50.level;
          pAStack_38->layer = local_50.layer;
        }
      }
    }
  }
  rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference(&this->m_renderbuffers,pRStack_18);
  return;
}

Assistant:

void ReferenceContext::deleteRenderbuffer (Renderbuffer* renderbuffer)
{
	if (m_renderbufferBinding == renderbuffer)
		bindRenderbuffer(GL_RENDERBUFFER, 0);

	// Unbind from currently bound framebuffers
	for (int ndx = 0; ndx < 2; ndx++)
	{
		rc::Framebuffer* framebufferBinding = ndx ? m_drawFramebufferBinding : m_readFramebufferBinding;
		if (framebufferBinding)
		{
			int releaseRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
								+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
			{
				Framebuffer::Attachment& attachment = framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
				if (attachment.name == renderbuffer->getName())
				{
					for (int refNdx = 0; refNdx < releaseRefCount; refNdx++)
						releaseFboAttachmentReference(attachment);
					attachment = Framebuffer::Attachment();
				}
			}
		}
	}

	DE_ASSERT(renderbuffer->getRefCount() == 1);
	m_renderbuffers.releaseReference(renderbuffer);
}